

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O2

unique_ptr<Descriptor,_std::default_delete<Descriptor>_> __thiscall
wallet::GetDescriptor
          (wallet *this,CWallet *wallet,CCoinControl *coin_control,CScript *script_pubkey)

{
  _Base_ptr p_Var1;
  long in_FS_OFFSET;
  MultiSigningProvider providers;
  __uniq_ptr_impl<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_> local_98;
  long *local_90;
  MultiSigningProvider local_88;
  undefined1 local_68 [24];
  _Base_ptr local_50;
  size_t local_38;
  
  local_38 = *(size_t *)(in_FS_OFFSET + 0x28);
  local_88.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__MultiSigningProvider_00642eb8;
  local_88.m_providers.
  super__Vector_base<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>,_std::allocator<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.m_providers.
  super__Vector_base<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>,_std::allocator<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.m_providers.
  super__Vector_base<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>,_std::allocator<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CWallet::GetScriptPubKeyMans
            ((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
              *)local_68,wallet,script_pubkey);
  for (p_Var1 = local_50; p_Var1 != (_Base_ptr)(local_68 + 8);
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var1)) {
    (**(code **)(**(long **)(p_Var1 + 1) + 0xa8))(&local_90,*(long **)(p_Var1 + 1),script_pubkey);
    MultiSigningProvider::AddProvider
              (&local_88,
               (unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>)&local_90);
    if (local_90 != (long *)0x0) {
      (**(code **)(*local_90 + 8))();
    }
    local_90 = (long *)0x0;
  }
  std::
  _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  ::~_Rb_tree((_Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
               *)local_68);
  if (coin_control != (CCoinControl *)0x0) {
    std::make_unique<FlatSigningProvider,FlatSigningProvider_const&>
              ((FlatSigningProvider *)local_68);
    local_98._M_t.
    super__Tuple_impl<0UL,_FlatSigningProvider_*,_std::default_delete<FlatSigningProvider>_>.
    super__Head_base<0UL,_FlatSigningProvider_*,_false>._M_head_impl =
         (tuple<FlatSigningProvider_*,_std::default_delete<FlatSigningProvider>_>)
         (tuple<FlatSigningProvider_*,_std::default_delete<FlatSigningProvider>_>)local_68._0_8_;
    local_68._0_8_ =
         (__uniq_ptr_impl<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_>)0x0;
    MultiSigningProvider::AddProvider
              (&local_88,
               (unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>)&local_98);
    if ((_Tuple_impl<0UL,_FlatSigningProvider_*,_std::default_delete<FlatSigningProvider>_>)
        local_98._M_t.
        super__Tuple_impl<0UL,_FlatSigningProvider_*,_std::default_delete<FlatSigningProvider>_>.
        super__Head_base<0UL,_FlatSigningProvider_*,_false>._M_head_impl !=
        (FlatSigningProvider *)0x0) {
      (**(code **)(*(_func_int **)
                    local_98._M_t.
                    super__Tuple_impl<0UL,_FlatSigningProvider_*,_std::default_delete<FlatSigningProvider>_>
                    .super__Head_base<0UL,_FlatSigningProvider_*,_false>._M_head_impl + 8))();
    }
    local_98._M_t.
    super__Tuple_impl<0UL,_FlatSigningProvider_*,_std::default_delete<FlatSigningProvider>_>.
    super__Head_base<0UL,_FlatSigningProvider_*,_false>._M_head_impl =
         (tuple<FlatSigningProvider_*,_std::default_delete<FlatSigningProvider>_>)
         (_Tuple_impl<0UL,_FlatSigningProvider_*,_std::default_delete<FlatSigningProvider>_>)0x0;
    std::unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_>::~unique_ptr
              ((unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_> *)
               local_68);
  }
  InferDescriptor((CScript *)this,(SigningProvider *)script_pubkey);
  MultiSigningProvider::~MultiSigningProvider(&local_88);
  if (*(size_t *)(in_FS_OFFSET + 0x28) == local_38) {
    return (__uniq_ptr_data<Descriptor,_std::default_delete<Descriptor>,_true,_true>)
           (__uniq_ptr_data<Descriptor,_std::default_delete<Descriptor>,_true,_true>)this;
  }
  __stack_chk_fail();
}

Assistant:

static std::unique_ptr<Descriptor> GetDescriptor(const CWallet* wallet, const CCoinControl* coin_control,
                                                 const CScript script_pubkey)
{
    MultiSigningProvider providers;
    for (const auto spkman: wallet->GetScriptPubKeyMans(script_pubkey)) {
        providers.AddProvider(spkman->GetSolvingProvider(script_pubkey));
    }
    if (coin_control) {
        providers.AddProvider(std::make_unique<FlatSigningProvider>(coin_control->m_external_provider));
    }
    return InferDescriptor(script_pubkey, providers);
}